

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleInstanceImages::ImageSampleInstanceImages
          (ImageSampleInstanceImages *this,DeviceInterface *vki,VkDevice device,
          deUint32 queueFamilyIndex,VkQueue queue,Allocator *allocator,
          VkDescriptorType descriptorType,ShaderInputInterface shaderInterface,
          VkImageViewType viewType,deUint32 baseMipLevel,deUint32 baseArraySlice,bool immutable)

{
  RefData<vk::Handle<(vk::HandleType)20>_> data;
  RefData<vk::Handle<(vk::HandleType)20>_> data_00;
  int numImages;
  deUint32 dVar1;
  Move<vk::Handle<(vk::HandleType)20>_> local_e8;
  RefData<vk::Handle<(vk::HandleType)20>_> local_c8;
  Move<vk::Handle<(vk::HandleType)20>_> local_a8;
  RefData<vk::Handle<(vk::HandleType)20>_> local_88;
  byte local_51;
  Allocator *pAStack_50;
  bool immutable_local;
  Allocator *allocator_local;
  VkQueue queue_local;
  VkDevice pVStack_38;
  deUint32 queueFamilyIndex_local;
  VkDevice device_local;
  DeviceInterface *vki_local;
  ImageSampleInstanceImages *this_local;
  
  local_51 = immutable;
  pAStack_50 = allocator;
  allocator_local = (Allocator *)queue;
  queue_local._4_4_ = queueFamilyIndex;
  pVStack_38 = device;
  device_local = (VkDevice)vki;
  vki_local = (DeviceInterface *)this;
  numImages = getNumImages(descriptorType,shaderInterface);
  ImageInstanceImages::ImageInstanceImages
            (&this->super_ImageInstanceImages,vki,device,queueFamilyIndex,queue,allocator,
             descriptorType,viewType,numImages,baseMipLevel,baseArraySlice);
  this->m_descriptorType = descriptorType;
  this->m_shaderInterface = shaderInterface;
  this->m_isImmutable = (bool)(local_51 & 1);
  createRefSampler(&this->m_refSamplerA,true);
  createRefSampler(&this->m_refSamplerB,false);
  createSampler(&local_a8,(DeviceInterface *)device_local,pVStack_38,&this->m_refSamplerA,
                &(this->super_ImageInstanceImages).m_imageFormat);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_88,(Move *)&local_a8);
  data.deleter.m_deviceIface._0_4_ = (int)local_88.deleter.m_deviceIface;
  data.object.m_internal = local_88.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_88.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_88.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_88.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_88.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_88.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>::Unique(&this->m_samplerA,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::~Move(&local_a8);
  dVar1 = getInterfaceNumResources(this->m_shaderInterface);
  if (dVar1 == 1) {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::Move(&local_e8);
  }
  else {
    createSampler(&local_e8,(DeviceInterface *)device_local,pVStack_38,&this->m_refSamplerB,
                  &(this->super_ImageInstanceImages).m_imageFormat);
  }
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_c8,(Move *)&local_e8);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_c8.deleter.m_deviceIface;
  data_00.object.m_internal = local_c8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_c8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_c8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_c8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_c8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>::Unique(&this->m_samplerB,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::~Move(&local_e8);
  return;
}

Assistant:

ImageSampleInstanceImages::ImageSampleInstanceImages (const vk::DeviceInterface&	vki,
													  vk::VkDevice					device,
													  deUint32						queueFamilyIndex,
													  vk::VkQueue					queue,
													  vk::Allocator&				allocator,
													  vk::VkDescriptorType			descriptorType,
													  ShaderInputInterface			shaderInterface,
													  vk::VkImageViewType			viewType,
													  deUint32						baseMipLevel,
													  deUint32						baseArraySlice,
													  bool							immutable)
	: ImageInstanceImages	(vki,
							 device,
							 queueFamilyIndex,
							 queue,
							 allocator,
							 descriptorType,
							 viewType,
							 getNumImages(descriptorType, shaderInterface),
							 baseMipLevel,
							 baseArraySlice)
	, m_descriptorType		(descriptorType)
	, m_shaderInterface		(shaderInterface)
	, m_isImmutable			(immutable)
	, m_refSamplerA			(createRefSampler(true))
	, m_refSamplerB			(createRefSampler(false))
	, m_samplerA			(createSampler(vki, device, m_refSamplerA, m_imageFormat))
	, m_samplerB			((getInterfaceNumResources(m_shaderInterface) == 1u)
								? vk::Move<vk::VkSampler>()
								: createSampler(vki, device, m_refSamplerB, m_imageFormat))
{
}